

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

void __thiscall MppBufferService::destroy_group(MppBufferService *this,MppBufferGroupImpl *group)

{
  MppBufferMode MVar1;
  MppBufferType MVar2;
  RK_U32 RVar3;
  RK_U32 id;
  MppBufferType type;
  MppBufferMode mode;
  MppBufferGroupImpl *group_local;
  MppBufferService *this_local;
  
  MVar1 = group->mode;
  MVar2 = group->type;
  RVar3 = group->group_id;
  if ((group->count_used != 0) &&
     (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "group->count_used == 0","destroy_group",0x4a0), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((group->count_unused != 0) &&
     (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "group->count_unused == 0","destroy_group",0x4a1), (mpp_debug & 0x10000000) != 0))
  {
    abort();
  }
  if ((group->count_unused != 0) || (group->count_used != 0)) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_group_deinit mismatch counter used %4d unused %4d found\n"
               ,(char *)0x0,(ulong)(uint)group->count_used,(ulong)(uint)group->count_unused);
    group->count_unused = 0;
    group->count_used = 0;
  }
  buf_grp_add_log(group,GRP_DESTROY,"destroy_group");
  list_del_init(&group->list_group);
  hash_del(&group->hlist);
  pthread_mutex_destroy((pthread_mutex_t *)&group->buf_lock);
  if (group->logs != (MppBufLogs *)0x0) {
    buf_logs_deinit(group->logs);
    group->logs = (MppBufLogs *)0x0;
  }
  mpp_mem_pool_put_f("destroy_group",mpp_buf_grp_pool,group);
  this->group_count = this->group_count - 1;
  if (RVar3 == this->misc[MVar1][MVar2]) {
    this->misc[MVar1][MVar2] = 0;
    this->misc_count = this->misc_count - 1;
  }
  return;
}

Assistant:

void MppBufferService::destroy_group(MppBufferGroupImpl *group)
{
    MppBufferMode mode = group->mode;
    MppBufferType type = group->type;
    RK_U32 id = group->group_id;

    mpp_assert(group->count_used == 0);
    mpp_assert(group->count_unused == 0);
    if (group->count_unused || group->count_used) {
        mpp_err("mpp_buffer_group_deinit mismatch counter used %4d unused %4d found\n",
                group->count_used, group->count_unused);
        group->count_unused = 0;
        group->count_used   = 0;
    }

    buf_grp_add_log(group, GRP_DESTROY, __FUNCTION__);

    list_del_init(&group->list_group);
    hash_del(&group->hlist);
    pthread_mutex_destroy(&group->buf_lock);
    if (group->logs) {
        buf_logs_deinit(group->logs);
        group->logs = NULL;
    }
    mpp_mem_pool_put(mpp_buf_grp_pool, group);
    group_count--;

    if (id == misc[mode][type]) {
        misc[mode][type] = 0;
        misc_count--;
    }
}